

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hblas3.cxx
# Opt level: O2

void __thiscall
HBLAS3::
hblas3_gemm<HAXX::quaternion<double>,HAXX::quaternion<double>,std::complex<double>,double,(char)67,(char)84,100ul,100ul,100ul>
          (HBLAS3 *this)

{
  complex<double> ALPHA;
  ostream *poVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  quaternion<double> *x;
  pointer pqVar5;
  pointer pqVar6;
  double in_XMM0_Qa;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  complex<double> ALPHA_00;
  int32_t LDB;
  quaternion<double> *Y;
  quaternion<double> *in_stack_fffffffffffffcc8;
  string AFstr;
  ulong local_300;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> C;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> B;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> A;
  undefined1 local_2b0 [8];
  undefined8 local_2a8;
  shared_count sStack_2a0;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> SCR;
  char *local_280;
  char *local_278;
  undefined1 *local_270;
  undefined1 *local_268;
  char *local_260;
  char *local_258;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> CC;
  undefined **local_218;
  undefined1 local_210;
  undefined8 *local_208;
  char *local_200;
  undefined **local_1f8;
  undefined1 local_1f0;
  undefined ***local_1e8;
  ulong *local_1e0;
  undefined **local_1d8;
  undefined1 local_1d0;
  undefined ***local_1c8;
  char *local_1c0;
  undefined **local_1b8;
  undefined1 local_1b0;
  undefined ***local_1a8;
  undefined1 *local_1a0;
  undefined **local_198;
  undefined1 local_190;
  undefined ***local_188;
  char *local_180;
  undefined **local_178;
  undefined1 local_170;
  undefined ***local_168;
  quaternion<double> *local_160;
  undefined **local_158;
  undefined1 local_150;
  undefined ***local_148;
  char *local_140;
  undefined **local_138;
  undefined1 local_130;
  undefined ***local_128;
  quaternion<double> *local_120;
  quaternion<double> local_118;
  quaternion<double> __r;
  string BetaFstr;
  string AlphaFstr;
  string BFstr;
  value_type tstVal;
  quaternion<double> local_50;
  
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::vector
            (&A,10000,(allocator_type *)&AFstr);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::vector
            (&B,10000,(allocator_type *)&AFstr);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::vector
            (&C,10000,(allocator_type *)&AFstr);
  for (pqVar6 = A.
                super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pqVar5 = B.
               super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      pqVar6 != A.
                super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pqVar6 = pqVar6 + 1) {
    genRandom<HAXX::quaternion<double>>();
    in_XMM0_Qa = (double)CONCAT44(AFstr._M_dataplus._M_p._4_4_,(int32_t)AFstr._M_dataplus._M_p);
    pqVar6->_M_real = in_XMM0_Qa;
    pqVar6->_M_imag_i = (double)AFstr._M_string_length;
    pqVar6->_M_imag_j = (double)AFstr.field_2._M_allocated_capacity;
    pqVar6->_M_imag_k = (double)AFstr.field_2._8_8_;
  }
  for (; pqVar6 = C.
                  super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start,
      pqVar5 != B.
                super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pqVar5 = pqVar5 + 1) {
    genRandom<HAXX::quaternion<double>>();
    in_XMM0_Qa = (double)CONCAT44(AFstr._M_dataplus._M_p._4_4_,(int32_t)AFstr._M_dataplus._M_p);
    pqVar5->_M_real = in_XMM0_Qa;
    pqVar5->_M_imag_i = (double)AFstr._M_string_length;
    pqVar5->_M_imag_j = (double)AFstr.field_2._M_allocated_capacity;
    pqVar5->_M_imag_k = (double)AFstr.field_2._8_8_;
  }
  for (; pqVar6 != C.
                   super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish; pqVar6 = pqVar6 + 1) {
    genRandom<HAXX::quaternion<double>>();
    in_XMM0_Qa = (double)CONCAT44(AFstr._M_dataplus._M_p._4_4_,(int32_t)AFstr._M_dataplus._M_p);
    pqVar6->_M_real = in_XMM0_Qa;
    pqVar6->_M_imag_i = (double)AFstr._M_string_length;
    pqVar6->_M_imag_j = (double)AFstr.field_2._M_allocated_capacity;
    pqVar6->_M_imag_k = (double)AFstr.field_2._8_8_;
  }
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::vector(&CC,&C);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::vector
            (&SCR,100,(allocator_type *)&AFstr);
  genRandom<std::complex<double>>();
  dVar7 = genRandom<double>();
  t_str<HAXX::quaternion<double>>();
  t_str<HAXX::quaternion<double>>();
  t_str<std::complex<double>>();
  t_str<double>();
  std::operator<<((ostream *)&std::cout,"\n HBLAS GEMM TEST: \n");
  std::operator<<((ostream *)&std::cout,"   - _F =      DOUBLE    \n");
  poVar1 = std::operator<<((ostream *)&std::cout,"   - _AF =     ");
  poVar1 = std::operator<<(poVar1,(string *)&AFstr);
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<((ostream *)&std::cout,"   - _BF =     ");
  poVar1 = std::operator<<(poVar1,(string *)&BFstr);
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<((ostream *)&std::cout,"   - _AlphaF = ");
  poVar1 = std::operator<<(poVar1,(string *)&AlphaFstr);
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<((ostream *)&std::cout,"   - _BetaF =  ");
  poVar1 = std::operator<<(poVar1,(string *)&BetaFstr);
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<((ostream *)&std::cout,"   - _TA =     ");
  poVar1 = std::operator<<(poVar1,'C');
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<((ostream *)&std::cout,"   - _TB =     ");
  poVar1 = std::operator<<(poVar1,'T');
  std::operator<<(poVar1,"\n");
  std::operator<<((ostream *)&std::cout,"\n   PROBLEM DIMENSIONS\n");
  poVar1 = std::operator<<((ostream *)&std::cout,"     - N =     ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<((ostream *)&std::cout,"     - M =     ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<((ostream *)&std::cout,"     - K =     ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<((ostream *)&std::cout,"     - LDA =   ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<((ostream *)&std::cout,"     - LDB =   ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<((ostream *)&std::cout,"     - LDC =   ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,"\n");
  std::operator<<((ostream *)&std::cout,"\n");
  LDB = 0x17e783;
  lVar2 = std::chrono::_V2::system_clock::now();
  ALPHA._M_value._8_8_ =
       B.super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  ALPHA._M_value._0_8_ = 100;
  HAXX::
  HBLAS_GEMM<double,HAXX::quaternion<double>,HAXX::quaternion<double>,std::complex<double>,double>
            ((HAXX *)0x43,'T','d',100,100,
             (int32_t)A.
                      super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,ALPHA,(quaternion<double> *)0x64,
             (int32_t)C.
                      super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,(quaternion<double> *)0x64,LDB,
             in_XMM0_Qa,in_stack_fffffffffffffcc8,(int32_t)AFstr._M_dataplus._M_p);
  lVar3 = std::chrono::_V2::system_clock::now();
  poVar1 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::operator<<(poVar1," * GEMM took ");
  poVar1 = std::ostream::_M_insert<double>((double)(lVar3 - lVar2) / 1000000000.0);
  std::operator<<(poVar1," s\n\n");
  Y = (quaternion<double> *)0x1;
  for (uVar4 = 0; uVar4 < 100; uVar4 = uVar4 + 1) {
    ALPHA_00._M_value._8_8_ = 100;
    ALPHA_00._M_value._0_8_ =
         A.super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>.
         _M_impl.super__Vector_impl_data._M_start;
    HAXX::
    HBLAS_GEMV<double,HAXX::quaternion<double>,HAXX::quaternion<double>,std::complex<double>,double>
              ('C',100,100,ALPHA_00,
               B.
               super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar4,100,
               SCR.
               super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start,1,in_XMM0_Qa,Y,(int32_t)uVar4);
    for (local_300 = 0; local_300 < 100; local_300 = local_300 + 1) {
      lVar2 = uVar4 * 100 + local_300;
      pqVar6 = SCR.
               super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start + local_300;
      pqVar5 = CC.
               super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start + lVar2;
      __r._M_real = dVar7 * pqVar5->_M_real + pqVar6->_M_real;
      __r._M_imag_i = dVar7 * pqVar5->_M_imag_i + pqVar6->_M_imag_i;
      __r._M_imag_j = dVar7 * pqVar5->_M_imag_j + pqVar6->_M_imag_j;
      __r._M_imag_k = dVar7 * pqVar5->_M_imag_k + pqVar6->_M_imag_k;
      pqVar6 = C.
               super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start + lVar2;
      tstVal._M_real = pqVar6->_M_real;
      tstVal._M_imag_i = pqVar6->_M_imag_i;
      tstVal._M_imag_j = pqVar6->_M_imag_j;
      tstVal._M_imag_k = pqVar6->_M_imag_k;
      local_270 = &boost::unit_test::basic_cstring<char_const>::null;
      local_268 = &boost::unit_test::basic_cstring<char_const>::null;
      local_260 = 
      "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/hblas3.cxx";
      local_258 = "";
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_260,0x88,&local_270);
      HAXX::inv<double>(&local_50,&tstVal);
      HAXX::operator*(&local_118,&__r,&local_50);
      auVar8._8_8_ = 0;
      auVar8._0_8_ = local_118._M_imag_i;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = local_118._M_imag_j;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = local_118._M_imag_k;
      local_210 = 0;
      local_1f0 = 0;
      local_1d0 = 0;
      local_1b0 = 0;
      local_190 = 0;
      local_170 = 0;
      local_150 = 0;
      local_130 = 0;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = (local_118._M_real + -1.0) * (local_118._M_real + -1.0);
      auVar8 = vfmadd231sd_fma(auVar11,auVar8,auVar8);
      auVar8 = vfmadd231sd_fma(auVar8,auVar9,auVar9);
      auVar8 = vfmadd231sd_fma(auVar8,auVar10,auVar10);
      auVar8 = vsqrtsd_avx(auVar8,auVar8);
      local_2b0[0] = auVar8._0_8_ < 1e-12;
      local_2a8 = 0;
      sStack_2a0.pi_ = (sp_counted_base *)0x0;
      local_218 = &PTR__lazy_ostream_00219c88;
      local_208 = &boost::unit_test::lazy_ostream::inst;
      local_200 = "\n i = ";
      local_1f8 = &PTR__lazy_ostream_00219c48;
      local_1e8 = &local_218;
      local_1e0 = &local_300;
      local_1d8 = &PTR__lazy_ostream_00219c08;
      local_1c8 = &local_1f8;
      local_1c0 = " j = ";
      local_1b8 = &PTR__lazy_ostream_00219bc8;
      local_1a8 = &local_1d8;
      local_198 = &PTR__lazy_ostream_00219b88;
      local_188 = &local_1b8;
      local_180 = ", HBLAS_GEMM = ";
      local_178 = &PTR__lazy_ostream_00219b48;
      local_168 = &local_198;
      local_158 = &PTR__lazy_ostream_00219b08;
      local_148 = &local_178;
      local_140 = ", REFERENCE = ";
      local_138 = &PTR__lazy_ostream_00219ac8;
      local_128 = &local_158;
      local_280 = 
      "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/hblas3.cxx";
      local_278 = "";
      local_1a0 = &stack0xfffffffffffffcc8;
      local_160 = &tstVal;
      local_120 = &__r;
      boost::test_tools::tt_detail::report_assertion(local_2b0,&local_138,&local_280,0x88,1,1,0);
      Y = (quaternion<double> *)0x17ebdf;
      boost::detail::shared_count::~shared_count(&sStack_2a0);
    }
  }
  std::__cxx11::string::~string((string *)&BetaFstr);
  std::__cxx11::string::~string((string *)&AlphaFstr);
  std::__cxx11::string::~string((string *)&BFstr);
  std::__cxx11::string::~string((string *)&AFstr);
  std::_Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::
  ~_Vector_base(&SCR.
                 super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
               );
  std::_Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::
  ~_Vector_base(&CC.
                 super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
               );
  std::_Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::
  ~_Vector_base(&C.
                 super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
               );
  std::_Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::
  ~_Vector_base(&B.
                 super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
               );
  std::_Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::
  ~_Vector_base(&A.
                 super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
               );
  return;
}

Assistant:

void hblas3_gemm() {

  size_t NK = N*K;
  size_t KM = K*M;
  size_t NM = N*M;

  size_t LDA = ( _TA == 'N' ) ? N : K;
  size_t LDB = ( _TB == 'N' ) ? K : M;
  size_t LDC = N;

  // Random Quaternion vectors and matricies
  std::vector<_AF> A(NK);
  std::vector<_BF> B(KM);
  std::vector<qd>  C(NM);

  for(auto &x : A) x = genRandom<_AF>();
  for(auto &x : B) x = genRandom<_BF>();
  for(auto &x : C) x = genRandom<qd> ();

  std::vector<qd> CC(C);
  std::vector<qd> SCR(N);

  _AlphaF ALPHA = genRandom<_AlphaF>();
  _BetaF  BETA  = genRandom<_BetaF>();


  std::string AFstr     = t_str<_AF>(); 
  std::string BFstr     = t_str<_BF>(); 
  std::string AlphaFstr = t_str<_AlphaF>(); 
  std::string BetaFstr  = t_str<_BetaF>(); 
                
                


  std::cout << "\n HBLAS GEMM TEST: \n";
  std::cout << "   - _F =      DOUBLE    \n";
  std::cout << "   - _AF =     " << AFstr << "\n";
  std::cout << "   - _BF =     " << BFstr << "\n";
  std::cout << "   - _AlphaF = " << AlphaFstr << "\n";
  std::cout << "   - _BetaF =  " << BetaFstr << "\n";
  std::cout << "   - _TA =     " << _TA << "\n";
  std::cout << "   - _TB =     " << _TB << "\n";

  std::cout << "\n   PROBLEM DIMENSIONS\n";
  std::cout << "     - N =     " << N << "\n";
  std::cout << "     - M =     " << M << "\n";
  std::cout << "     - K =     " << K << "\n";
  std::cout << "     - LDA =   " << LDA << "\n";
  std::cout << "     - LDB =   " << LDB << "\n";
  std::cout << "     - LDC =   " << LDC << "\n";



  std::cout << "\n";



  auto gemmStart = std::chrono::high_resolution_clock::now();

  HBLAS_GEMM(_TA, _TB, N, M, K, ALPHA, &A[0], LDA, &B[0], LDB, BETA, 
    &C[0], LDC);

  auto gemmEnd = std::chrono::high_resolution_clock::now();

  std::chrono::duration<double> gemmDur = gemmEnd - gemmStart;
  std::cout << std::endl << " * GEMM took " << gemmDur.count() 
    << " s\n\n";


  HAXX_INT BStride = 1;
  if( _TB != 'N' ) BStride = LDB;
  if( _TB == 'C' ) 
    for(auto &x : B) x = HAXX::conj(x); 

  for(size_t j = 0; j < M; j++) {

    HAXX_INT BStart = j;
    if( _TB == 'N' ) BStart *= LDB;

    HBLAS_GEMV(_TA, N, K, ALPHA, &A[0], LDA, &B[BStart], BStride, 0., 
      &SCR[0], 1);

    for(size_t i = 0; i < N; i++) {

      size_t indx = RANK2_INDX(i,j,LDC);
      auto refVal = SCR[i] + BETA*CC[indx];
      auto tstVal = C[indx];

      BOOST_CHECK_MESSAGE( 
        CMP_Q( refVal, tstVal ),
        "\n i = " << i << 
          " j = " << j << 
          ", HBLAS_GEMM = " << tstVal << 
          ", REFERENCE = "  << refVal 
      );
    }
  }

}